

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Show.hpp
# Opt level: O0

void rc::showCollection<std::array<unsigned_long,4ul>>
               (string *prefix,string *suffix,array<unsigned_long,_4UL> *collection,ostream *os)

{
  const_iterator pvVar1;
  ostream *in_RCX;
  string *in_RSI;
  string *in_RDI;
  const_iterator it;
  const_iterator cend;
  const_iterator cbegin;
  unsigned_long *local_38;
  
  std::operator<<(in_RCX,in_RDI);
  local_38 = std::begin<std::array<unsigned_long,4ul>>((array<unsigned_long,_4UL> *)0x1d3c41);
  pvVar1 = std::end<std::array<unsigned_long,4ul>>((array<unsigned_long,_4UL> *)0x1d3c50);
  if (local_38 != pvVar1) {
    show<unsigned_long>(local_38,in_RCX);
    while (local_38 = local_38 + 1, local_38 != pvVar1) {
      std::operator<<(in_RCX,", ");
      show<unsigned_long>(local_38,in_RCX);
    }
  }
  std::operator<<(in_RCX,in_RSI);
  return;
}

Assistant:

void showCollection(const std::string &prefix,
                    const std::string &suffix,
                    const Collection &collection,
                    std::ostream &os) {
  os << prefix;
  auto cbegin = begin(collection);
  auto cend = end(collection);
  if (cbegin != cend) {
    show(*cbegin, os);
    for (auto it = ++cbegin; it != cend; it++) {
      os << ", ";
      show(*it, os);
    }
  }
  os << suffix;
}